

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

LocalFunctionId __thiscall Js::FunctionProxy::GetLocalFunctionId(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId LVar3;
  FunctionInfo *pFVar4;
  undefined4 *puVar5;
  FunctionProxy *this_local;
  
  pFVar4 = GetFunctionInfo(this);
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionInfo(this);
  LVar3 = FunctionInfo::GetLocalFunctionId(pFVar4);
  return LVar3;
}

Assistant:

inline Js::LocalFunctionId FunctionProxy::GetLocalFunctionId() const
    {
        Assert(GetFunctionInfo());
        return GetFunctionInfo()->GetLocalFunctionId();
    }